

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

void Cmd_currentpos(FCommandLine *argv,APlayerPawn *who,int key)

{
  long lVar1;
  undefined4 in_register_00000014;
  
  lVar1 = (&players)[(long)consoleplayer * 0x54];
  if (lVar1 != 0) {
    Printf("Current player position: (%1.3f,%1.3f,%1.3f), angle: %1.3f, floorheight: %1.3f, sector:%d, lightlevel: %d\n"
           ,*(undefined8 *)(lVar1 + 0x48),*(undefined8 *)(lVar1 + 0x50),
           *(undefined8 *)(lVar1 + 0x58),
           SUB84((double)((ulong)(*(double *)(lVar1 + 0xb0) * 11930464.711111112 +
                                 6755399441055744.0) & 0xffffffff) * 8.381903171539307e-08,0),
           *(undefined8 *)(lVar1 + 0x140),(ulong)*(uint *)(*(long *)(lVar1 + 0x130) + 0x20c),
           (ulong)(uint)(int)*(short *)(*(long *)(lVar1 + 0x130) + 0x112));
    return;
  }
  Printf("You are not in game!\n",who,CONCAT44(in_register_00000014,key));
  return;
}

Assistant:

CCMD(currentpos)
{
	AActor *mo = players[consoleplayer].mo;
	if(mo)
	{
		Printf("Current player position: (%1.3f,%1.3f,%1.3f), angle: %1.3f, floorheight: %1.3f, sector:%d, lightlevel: %d\n",
			mo->X(), mo->Y(), mo->Z(), mo->Angles.Yaw.Normalized360().Degrees, mo->floorz, mo->Sector->sectornum, mo->Sector->lightlevel);
	}
	else
	{
		Printf("You are not in game!\n");
	}
}